

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::get_program_binary(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  RenderContext *pRVar3;
  long lVar4;
  GLint bufSize;
  GLint linkStatus;
  GLint binaryPtr;
  GLenum binaryFormat;
  GLsizei binaryLength;
  ProgramSources sources;
  ShaderProgram programInvalid;
  ShaderProgram program;
  GLint local_394;
  GLint local_390 [2];
  value_type local_388;
  value_type local_368;
  undefined1 local_348 [16];
  undefined1 local_338 [104];
  ios_base local_2d0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2b8;
  undefined1 local_298 [208];
  undefined1 local_1c8 [152];
  GLuint local_130;
  ShaderProgram local_f8;
  
  pRVar3 = ctx->m_renderCtx;
  local_1c8._0_8_ = local_1c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  paVar1 = &local_388.field_2;
  local_388._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,"");
  local_298[0x10] = 0;
  local_298._17_8_ = 0;
  local_298._0_8_ = (pointer)0x0;
  local_298[8] = 0;
  local_298._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_348,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348,(value_type *)local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_338 + 8),&local_388);
  glu::ShaderProgram::ShaderProgram(&local_f8,pRVar3,(ProgramSources *)local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_298);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_2b8);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_348 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
  }
  pRVar3 = ctx->m_renderCtx;
  local_388._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_388,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n","");
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368);
  local_298[0x10] = 0;
  local_298._17_8_ = 0;
  local_298._0_8_ = (pointer)0x0;
  local_298[8] = 0;
  local_298._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_348,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348,&local_388);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_338 + 8),&local_368);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1c8,pRVar3,(ProgramSources *)local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_298);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_2b8);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_348 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != paVar1) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  local_388._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_368._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_390[1] = 0xffffffff;
  local_394 = -1;
  local_390[0] = -1;
  local_348._0_8_ = (pointer)local_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,
             "GL_INVALID_OPERATION is generated if bufSize is less than the size of GL_PROGRAM_BINARY_LENGTH for program."
             ,"");
  NegativeTestContext::beginSection(ctx,(string *)local_348);
  if ((pointer)local_348._0_8_ != (pointer)local_338) {
    operator_delete((void *)local_348._0_8_,(ulong)(local_338._0_8_ + 1));
  }
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_f8.m_program.m_program,0x8741,&local_394);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,local_f8.m_program.m_program,0x8b82,local_390);
  local_348._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar2 = (ostringstream *)(local_348 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// GL_PROGRAM_BINARY_LENGTH = ",0x1e);
  std::ostream::operator<<(poVar2,local_394);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_2d0);
  local_348._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar2 = (ostringstream *)(local_348 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// GL_LINK_STATUS = ",0x14);
  std::ostream::operator<<(poVar2,local_390[0]);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_2d0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetProgramBinary
            (&ctx->super_CallLogWrapper,local_f8.m_program.m_program,0,(GLsizei *)&local_368,
             (GLenum *)&local_388,local_390 + 1);
  NegativeTestContext::expectError(ctx,0x502);
  if (0 < local_394) {
    glu::CallLogWrapper::glGetProgramBinary
              (&ctx->super_CallLogWrapper,local_f8.m_program.m_program,local_394 + -1,
               (GLsizei *)&local_368,(GLenum *)&local_388,local_390 + 1);
    NegativeTestContext::expectError(ctx,0x502);
  }
  NegativeTestContext::endSection(ctx);
  local_348._0_8_ = (pointer)local_338;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,
             "GL_INVALID_OPERATION is generated if GL_LINK_STATUS for the program object is false.",
             "");
  NegativeTestContext::beginSection(ctx,(string *)local_348);
  if ((pointer)local_348._0_8_ != (pointer)local_338) {
    operator_delete((void *)local_348._0_8_,(ulong)(local_338._0_8_ + 1));
  }
  glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,local_130,0x8741,&local_394);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,local_130,0x8b82,local_390);
  local_348._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar2 = (ostringstream *)(local_348 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar2,"// GL_PROGRAM_BINARY_LENGTH = ",0x1e);
  std::ostream::operator<<(poVar2,local_394);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_2d0);
  local_348._0_8_ = (ctx->super_CallLogWrapper).m_log;
  poVar2 = (ostringstream *)(local_348 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"// GL_LINK_STATUS = ",0x14);
  std::ostream::operator<<(poVar2,local_390[0]);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_2d0);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetProgramBinary
            (&ctx->super_CallLogWrapper,local_130,local_394,(GLsizei *)&local_368,
             (GLenum *)&local_388,local_390 + 1);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1c8);
  glu::ShaderProgram::~ShaderProgram(&local_f8);
  return;
}

Assistant:

void get_program_binary (NegativeTestContext& ctx)
{
	glu::ShaderProgram				program			(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	glu::ShaderProgram				programInvalid	(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, ""));
	GLenum							binaryFormat	= -1;
	GLsizei							binaryLength	= -1;
	GLint							binaryPtr		= -1;
	GLint							bufSize			= -1;
	GLint							linkStatus		= -1;

	ctx.beginSection("GL_INVALID_OPERATION is generated if bufSize is less than the size of GL_PROGRAM_BINARY_LENGTH for program.");
	ctx.glGetProgramiv		(program.getProgram(), GL_PROGRAM_BINARY_LENGTH,	&bufSize);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glGetProgramiv		(program.getProgram(), GL_LINK_STATUS,				&linkStatus);
	ctx.getLog() << TestLog::Message << "// GL_PROGRAM_BINARY_LENGTH = " << bufSize << TestLog::EndMessage;
	ctx.getLog() << TestLog::Message << "// GL_LINK_STATUS = " << linkStatus << TestLog::EndMessage;
	ctx.expectError		(GL_NO_ERROR);

	ctx.glGetProgramBinary	(program.getProgram(), 0, &binaryLength, &binaryFormat, &binaryPtr);
	ctx.expectError		(GL_INVALID_OPERATION);
	if (bufSize > 0)
	{
		ctx.glGetProgramBinary	(program.getProgram(), bufSize-1, &binaryLength, &binaryFormat, &binaryPtr);
		ctx.expectError		(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if GL_LINK_STATUS for the program object is false.");
	ctx.glGetProgramiv		(programInvalid.getProgram(), GL_PROGRAM_BINARY_LENGTH,	&bufSize);
	ctx.expectError		(GL_NO_ERROR);
	ctx.glGetProgramiv		(programInvalid.getProgram(), GL_LINK_STATUS,			&linkStatus);
	ctx.getLog() << TestLog::Message << "// GL_PROGRAM_BINARY_LENGTH = " << bufSize << TestLog::EndMessage;
	ctx.getLog() << TestLog::Message << "// GL_LINK_STATUS = " << linkStatus << TestLog::EndMessage;
	ctx.expectError		(GL_NO_ERROR);

	ctx.glGetProgramBinary	(programInvalid.getProgram(), bufSize, &binaryLength, &binaryFormat, &binaryPtr);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.endSection();
}